

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::
AdapterPromiseNode<kj::AuthenticatedStream,_kj::(anonymous_namespace)::AggregateConnectionReceiver::Waiter>
::reject(AdapterPromiseNode<kj::AuthenticatedStream,_kj::(anonymous_namespace)::AggregateConnectionReceiver::Waiter>
         *this,Exception *exception)

{
  undefined8 uVar1;
  ExceptionOrValue local_1e0;
  Maybe<kj::AuthenticatedStream> local_48;
  
  if (this->waiting == true) {
    this->waiting = false;
    local_1e0.exception.ptr.isSet = true;
    local_1e0.exception.ptr.field_1.value.ownFile.content.ptr = (exception->ownFile).content.ptr;
    local_1e0.exception.ptr.field_1.value.ownFile.content.size_ = (exception->ownFile).content.size_
    ;
    local_1e0.exception.ptr.field_1.value.ownFile.content.disposer =
         (exception->ownFile).content.disposer;
    (exception->ownFile).content.ptr = (char *)0x0;
    (exception->ownFile).content.size_ = 0;
    local_1e0.exception.ptr.field_1.value.file = exception->file;
    local_1e0.exception.ptr.field_1._32_4_ = exception->line;
    local_1e0.exception.ptr.field_1._36_4_ = exception->type;
    local_1e0.exception.ptr.field_1.value.description.content.ptr =
         (exception->description).content.ptr;
    local_1e0.exception.ptr.field_1.value.description.content.size_ =
         (exception->description).content.size_;
    local_1e0.exception.ptr.field_1.value.description.content.disposer =
         (exception->description).content.disposer;
    (exception->description).content.ptr = (char *)0x0;
    (exception->description).content.size_ = 0;
    local_1e0.exception.ptr.field_1.value.context.ptr.disposer = (exception->context).ptr.disposer;
    local_1e0.exception.ptr.field_1.value.context.ptr.ptr = (exception->context).ptr.ptr;
    (exception->context).ptr.ptr = (Context *)0x0;
    local_1e0.exception.ptr.field_1.value.remoteTrace.content.ptr =
         (exception->remoteTrace).content.ptr;
    local_1e0.exception.ptr.field_1.value.remoteTrace.content.size_ =
         (exception->remoteTrace).content.size_;
    local_1e0.exception.ptr.field_1.value.remoteTrace.content.disposer =
         (exception->remoteTrace).content.disposer;
    (exception->remoteTrace).content.ptr = (char *)0x0;
    (exception->remoteTrace).content.size_ = 0;
    memcpy((void *)((long)&local_1e0.exception.ptr.field_1 + 0x68),exception->trace,0x105);
    local_1e0.exception.ptr.field_1.value.details.builder.ptr = (exception->details).builder.ptr;
    local_1e0.exception.ptr.field_1.value.details.builder.pos = (exception->details).builder.pos;
    local_1e0.exception.ptr.field_1.value.details.builder.endPtr =
         (exception->details).builder.endPtr;
    local_1e0.exception.ptr.field_1.value.details.builder.disposer =
         (exception->details).builder.disposer;
    (exception->details).builder.endPtr = (Detail *)0x0;
    (exception->details).builder.ptr = (Detail *)0x0;
    (exception->details).builder.pos = (RemoveConst<kj::Exception::Detail> *)0x0;
    local_48.ptr.isSet = false;
    ExceptionOrValue::operator=(&(this->result).super_ExceptionOrValue,&local_1e0);
    Maybe<kj::AuthenticatedStream>::operator=(&(this->result).value,&local_48);
    uVar1 = local_48.ptr.field_1.value.peerIdentity.ptr;
    if (local_48.ptr.isSet == true) {
      if (local_48.ptr.field_1.value.peerIdentity.ptr != (PeerIdentity *)0x0) {
        local_48.ptr.field_1.value.peerIdentity.ptr = (PeerIdentity *)0x0;
        (**(local_48.ptr.field_1.value.peerIdentity.disposer)->_vptr_Disposer)
                  (local_48.ptr.field_1.value.peerIdentity.disposer,
                   ((PeerIdentity *)uVar1)->_vptr_PeerIdentity[-2] +
                   (long)&((PeerIdentity *)uVar1)->_vptr_PeerIdentity);
      }
      uVar1 = local_48.ptr.field_1.value.stream.ptr;
      if (local_48.ptr.field_1.value.stream.ptr != (AsyncIoStream *)0x0) {
        local_48.ptr.field_1.value.stream.ptr = (AsyncIoStream *)0x0;
        (**(local_48.ptr.field_1.value.stream.disposer)->_vptr_Disposer)
                  (local_48.ptr.field_1.value.stream.disposer,
                   (((AsyncIoStream *)uVar1)->super_AsyncInputStream)._vptr_AsyncInputStream[-2] +
                   (long)&(((AsyncIoStream *)uVar1)->super_AsyncInputStream)._vptr_AsyncInputStream)
        ;
      }
    }
    if (local_1e0.exception.ptr.isSet == true) {
      Exception::~Exception(&local_1e0.exception.ptr.field_1.value);
    }
    PromiseNode::OnReadyEvent::arm(&(this->super_AdapterPromiseNodeBase).onReadyEvent);
  }
  return;
}

Assistant:

void reject(Exception&& exception) override {
    if (waiting) {
      waiting = false;
      result = ExceptionOr<T>(false, kj::mv(exception));
      setReady();
    }
  }